

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O3

void visceral_three(CHAR_DATA *ch)

{
  int idam;
  CHAR_DATA *ch_local;
  string local_58;
  string local_38;
  
  if (ch->disrupted == false) {
    ch_local = ch;
    if (ch->fighting == (CHAR_DATA *)0x0) {
      act("$n and $s minions blissfully writhe in the carnage, praising the Dark Gods.",ch,
          (void *)0x0,(void *)0x0,0);
      act("You blissfully writhe in the carnage, praising the Dark Gods.",ch,(void *)0x0,(void *)0x0
          ,3);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"visceral_three","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"visceral_four","");
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,6,&local_38,&local_58,visceral_four,&ch_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      send_to_char("The dark powers are furious at the disruption of the unholy orgy!\n\r",ch);
      act("A swirling black cloud coalesces above and lashes out at $n!",ch,(void *)0x0,(void *)0x0,
          0);
      idam = dice(0x12,0x12);
      damage_new(ch,ch,idam,(int)gsn_unholy_bond,9,true,false,0,1,"a nether bolt*");
      ch->disrupted = true;
    }
  }
  return;
}

Assistant:

void visceral_three(CHAR_DATA *ch)
{
	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The dark powers are furious at the disruption of the unholy orgy!\n\r", ch);

		act("A swirling black cloud coalesces above and lashes out at $n!", ch, nullptr, nullptr, TO_ROOM);

		damage_new(ch, ch, dice(18, 18), gsn_unholy_bond, DAM_NEGATIVE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "a nether bolt*");

		ch->disrupted = true;
		return;
	}

	act("$n and $s minions blissfully writhe in the carnage, praising the Dark Gods.", ch, 0, 0, TO_ROOM);
	act("You blissfully writhe in the carnage, praising the Dark Gods.", ch, 0, 0, TO_CHAR);

	RS.Queue.AddToQueue(6, "visceral_three", "visceral_four", visceral_four, ch);
}